

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

int AddTimeout(stTimeout_t *apTimeout,stTimeoutItem_t *apItem,unsigned_long_long allNow)

{
  stTimeoutItemLink_t *psVar1;
  stTimeoutItem_t *psVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  stTimeoutItemLink_t *psVar7;
  
  uVar5 = apTimeout->ullStart;
  if (uVar5 == 0) {
    apTimeout->ullStart = allNow;
    apTimeout->llStartIdx = 0;
    uVar5 = allNow;
  }
  else if (allNow < uVar5) {
    return 0x188;
  }
  iVar4 = 399;
  if ((allNow <= apItem->ullExpireTime) && (iVar4 = 0, apItem->pLink == (stTimeoutItemLink_t *)0x0))
  {
    uVar5 = apItem->ullExpireTime - uVar5;
    uVar6 = (ulong)apTimeout->iItemSize;
    uVar3 = uVar6 - 1;
    if (uVar5 < uVar6) {
      uVar3 = uVar5;
    }
    psVar1 = apTimeout->pItems;
    iVar4 = 0;
    uVar6 = (uVar3 + apTimeout->llStartIdx) % uVar6;
    psVar2 = psVar1[uVar6].tail;
    psVar7 = (stTimeoutItemLink_t *)&psVar2->pNext;
    if (psVar2 == (stTimeoutItem_t *)0x0) {
      psVar7 = psVar1 + uVar6;
    }
    psVar7->head = apItem;
    psVar1[uVar6].tail = apItem;
    apItem->pPrev = psVar2;
    apItem->pNext = (stTimeoutItem_t *)0x0;
    apItem->pLink = psVar1 + uVar6;
  }
  return iVar4;
}

Assistant:

int AddTimeout( stTimeout_t *apTimeout,stTimeoutItem_t *apItem ,unsigned long long allNow )
{
	if( apTimeout->ullStart == 0 )
	{
		apTimeout->ullStart = allNow;
		apTimeout->llStartIdx = 0;
	}
	if( allNow < apTimeout->ullStart )
	{
		co_log_err("CO_ERR: AddTimeout line %d allNow %llu apTimeout->ullStart %llu",
					__LINE__,allNow,apTimeout->ullStart);

		return __LINE__;
	}
	if( apItem->ullExpireTime < allNow )
	{
		co_log_err("CO_ERR: AddTimeout line %d apItem->ullExpireTime %llu allNow %llu apTimeout->ullStart %llu",
					__LINE__,apItem->ullExpireTime,allNow,apTimeout->ullStart);

		return __LINE__;
	}
	unsigned long long diff = apItem->ullExpireTime - apTimeout->ullStart;

	if( diff >= (unsigned long long)apTimeout->iItemSize )
	{
		diff = apTimeout->iItemSize - 1;
		co_log_err("CO_ERR: AddTimeout line %d diff %d",
					__LINE__,diff);

		//return __LINE__;
	}
	AddTail( apTimeout->pItems + ( apTimeout->llStartIdx + diff ) % apTimeout->iItemSize , apItem );

	return 0;
}